

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FkClearTriggerCache(sqlite3 *db,int iDb)

{
  int in_ESI;
  long in_RDI;
  FKey *pFKey;
  Table *pTab;
  Hash *pHash;
  HashElem *k;
  Trigger *in_stack_ffffffffffffffc8;
  sqlite3 *dbMem;
  undefined8 *local_18;
  
  for (local_18 = *(undefined8 **)
                   (*(long *)(*(long *)(in_RDI + 0x20) + (long)in_ESI * 0x20 + 0x18) + 0x10);
      local_18 != (undefined8 *)0x0; local_18 = (undefined8 *)*local_18) {
    if (*(char *)(local_18[2] + 0x3f) == '\0') {
      for (dbMem = *(sqlite3 **)(local_18[2] + 0x48); dbMem != (sqlite3 *)0x0;
          dbMem = (sqlite3 *)dbMem->pVdbe) {
        fkTriggerDelete(dbMem,in_stack_ffffffffffffffc8);
        dbMem->flags = 0;
        fkTriggerDelete(dbMem,in_stack_ffffffffffffffc8);
        dbMem->lastRowid = 0;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkClearTriggerCache(sqlite3 *db, int iDb){
  HashElem *k;
  Hash *pHash = &db->aDb[iDb].pSchema->tblHash;
  for(k=sqliteHashFirst(pHash); k; k=sqliteHashNext(k)){
    Table *pTab = sqliteHashData(k);
    FKey *pFKey;
    if( !IsOrdinaryTable(pTab) ) continue;
    for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
      fkTriggerDelete(db, pFKey->apTrigger[0]); pFKey->apTrigger[0] = 0;
      fkTriggerDelete(db, pFKey->apTrigger[1]); pFKey->apTrigger[1] = 0;
    }
  }
}